

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O0

IXML_Node_conflict * ixmlNode_cloneNode(IXML_Node_conflict *nodeptr,int deep)

{
  IXML_Attr *local_20;
  IXML_Node_conflict *node;
  int deep_local;
  IXML_Node_conflict *nodeptr_local;
  
  local_20 = (IXML_Attr *)0x0;
  if (nodeptr != (IXML_Node_conflict *)0x0) {
    if (nodeptr->nodeType == eATTRIBUTE_NODE) {
      local_20 = ixmlNode_cloneAttrDirect((IXML_Attr *)nodeptr);
    }
    else {
      local_20 = (IXML_Attr *)ixmlNode_cloneNodeTree(nodeptr,deep);
    }
  }
  return &local_20->n;
}

Assistant:

IXML_Node *ixmlNode_cloneNode(IXML_Node *nodeptr, int deep)
{
	IXML_Node *node = 0;

	if (!nodeptr) {
		goto end_function;
	}

	switch (nodeptr->nodeType) {
	case eATTRIBUTE_NODE:
		node = (IXML_Node *)ixmlNode_cloneAttrDirect(
			(IXML_Attr *)nodeptr);
		break;
	default:
		node = ixmlNode_cloneNodeTree(nodeptr, deep);
		break;
	}

end_function:
	return node;
}